

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_clone(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_DATA *pOVar2;
  CHAR_DATA *pCVar3;
  long in_RDI;
  char buf [4608];
  OBJ_DATA *new_obj;
  CHAR_DATA *clone_1;
  OBJ_DATA *clone;
  OBJ_DATA *obj;
  CHAR_DATA *mob;
  char *rest;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffdb98;
  OBJ_DATA *in_stack_ffffffffffffdba0;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  CHAR_DATA *in_stack_ffffffffffffdbb0;
  CHAR_DATA *in_stack_ffffffffffffdbb8;
  CHAR_DATA *in_stack_ffffffffffffdbc0;
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  CHAR_DATA *in_stack_ffffffffffffdbd0;
  int in_stack_ffffffffffffdc4c;
  OBJ_DATA *in_stack_ffffffffffffdc50;
  MOB_INDEX_DATA *in_stack_ffffffffffffdc70;
  char *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  OBJ_DATA *local_1230;
  CHAR_DATA *local_1228;
  char local_1218;
  int in_stack_ffffffffffffedec;
  long in_stack_ffffffffffffedf0;
  long in_stack_ffffffffffffedf8;
  OBJ_DATA *in_stack_ffffffffffffee00;
  CHAR_DATA *in_stack_ffffffffffffee08;
  char *in_stack_ffffffffffffee10;
  
  one_argument((char *)in_stack_ffffffffffffdba0,(char *)in_stack_ffffffffffffdb98);
  if (local_1218 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
  }
  else {
    bVar1 = str_prefix((char *)in_stack_ffffffffffffdbc8,(char *)in_stack_ffffffffffffdbc0);
    if (bVar1) {
      bVar1 = str_prefix((char *)in_stack_ffffffffffffdbc8,(char *)in_stack_ffffffffffffdbc0);
      if ((bVar1) &&
         (bVar1 = str_prefix((char *)in_stack_ffffffffffffdbc8,(char *)in_stack_ffffffffffffdbc0),
         bVar1)) {
        local_1228 = get_char_room(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
        local_1230 = get_obj_here(in_stack_ffffffffffffdba8,(char *)in_stack_ffffffffffffdba0);
        if ((local_1228 == (CHAR_DATA *)0x0) && (local_1230 == (OBJ_DATA *)0x0)) {
          send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
          return;
        }
      }
      else {
        local_1230 = (OBJ_DATA *)0x0;
        local_1228 = get_char_room(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
        if (local_1228 == (CHAR_DATA *)0x0) {
          send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
          return;
        }
      }
    }
    else {
      local_1228 = (CHAR_DATA *)0x0;
      local_1230 = get_obj_here(in_stack_ffffffffffffdba8,(char *)in_stack_ffffffffffffdba0);
      if (local_1230 == (OBJ_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
        return;
      }
    }
    if (local_1230 == (OBJ_DATA *)0x0) {
      if (local_1228 != (CHAR_DATA *)0x0) {
        bVar1 = is_npc(in_stack_ffffffffffffdb98);
        if (bVar1) {
          if ((((((local_1228->level < 0x15) ||
                 (bVar1 = is_trusted(in_stack_ffffffffffffdb98,0), bVar1)) &&
                ((local_1228->level < 0xb ||
                 (bVar1 = is_trusted(in_stack_ffffffffffffdb98,0), bVar1)))) &&
               ((local_1228->level < 6 || (bVar1 = is_trusted(in_stack_ffffffffffffdb98,0), bVar1)))
               ) && ((local_1228->level < 1 ||
                     (bVar1 = is_trusted(in_stack_ffffffffffffdb98,0), bVar1)))) &&
             (bVar1 = is_trusted(in_stack_ffffffffffffdb98,0), bVar1)) {
            pCVar3 = create_mobile(in_stack_ffffffffffffdc70);
            clone_mobile(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
            for (local_1230 = local_1228->carrying; local_1230 != (OBJ_DATA *)0x0;
                local_1230 = local_1230->next_content) {
              bVar1 = obj_check(in_stack_ffffffffffffdb98,(OBJ_DATA *)0x593dcf);
              if (bVar1) {
                pOVar2 = create_object((OBJ_INDEX_DATA *)in_stack_ffffffffffffdc50,
                                       in_stack_ffffffffffffdc4c);
                clone_object((OBJ_DATA *)in_stack_ffffffffffffdbc0,
                             (OBJ_DATA *)in_stack_ffffffffffffdbb8);
                recursive_clone(in_stack_ffffffffffffdbb0,(OBJ_DATA *)in_stack_ffffffffffffdba8,
                                in_stack_ffffffffffffdba0);
                obj_to_char(in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
                pOVar2->wear_loc = local_1230->wear_loc;
              }
            }
            char_to_room(in_stack_ffffffffffffdbd0,(ROOM_INDEX_DATA *)in_stack_ffffffffffffdbc8);
            act((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,
                in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,0);
            act((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,
                in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,0);
            sprintf(&stack0xffffffffffffdbb8,"$N clones %s.",pCVar3->short_descr);
            get_trust((CHAR_DATA *)&stack0xffffffffffffdbb8);
            wiznet(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                   in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
          }
          else {
            send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
          }
        }
        else {
          send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
        }
      }
    }
    else {
      bVar1 = obj_check(in_stack_ffffffffffffdb98,(OBJ_DATA *)0x593b06);
      if (bVar1) {
        pOVar2 = create_object((OBJ_INDEX_DATA *)in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c
                              );
        clone_object((OBJ_DATA *)in_stack_ffffffffffffdbc0,(OBJ_DATA *)in_stack_ffffffffffffdbb8);
        if (local_1230->carried_by == (CHAR_DATA *)0x0) {
          obj_to_room(pOVar2,*(ROOM_INDEX_DATA **)(in_RDI + 0xa8));
        }
        else {
          obj_to_char(in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
        }
        recursive_clone(in_stack_ffffffffffffdbb0,(OBJ_DATA *)in_stack_ffffffffffffdba8,
                        in_stack_ffffffffffffdba0);
        act((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,
            in_stack_ffffffffffffdb98,0);
        act((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,
            in_stack_ffffffffffffdb98,0);
        get_trust(in_stack_ffffffffffffdb98);
        wiznet(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
               in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
      }
    }
  }
  return;
}

Assistant:

void do_clone(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *rest;
	CHAR_DATA *mob;
	OBJ_DATA *obj;

	rest = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Clone what?\n\r", ch);
		return;
	}

	if (!str_prefix(arg, "object"))
	{
		mob = nullptr;
		obj = get_obj_here(ch, rest);

		if (obj == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg, "mobile") || !str_prefix(arg, "character"))
	{
		obj = nullptr;
		mob = get_char_room(ch, rest);

		if (mob == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}
	else /* find both */
	{
		mob = get_char_room(ch, argument);
		obj = get_obj_here(ch, argument);
		if (mob == nullptr && obj == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}

	/* clone an object */
	if (obj != nullptr)
	{
		OBJ_DATA *clone;

		if (!obj_check(ch, obj))
		{
			send_to_char("Your powers are not great enough for such a task.\n\r", ch);
			return;
		}

		clone = create_object(obj->pIndexData, 0);
		clone_object(obj, clone);

		if (obj->carried_by != nullptr)
			obj_to_char(clone, ch);
		else
			obj_to_room(clone, ch->in_room);

		recursive_clone(ch, obj, clone);

		act("$n has created $p.", ch, clone, nullptr, TO_ROOM);
		act("You clone $p.", ch, clone, nullptr, TO_CHAR);

		wiznet("$N clones $p.", ch, clone, WIZ_LOAD, WIZ_SECURE, get_trust(ch));
	}
	else if (mob != nullptr)
	{
		CHAR_DATA *clone;
		OBJ_DATA *new_obj;
		char buf[MAX_STRING_LENGTH];

		if (!is_npc(mob))
		{
			send_to_char("You can only clone mobiles.\n\r", ch);
			return;
		}

		if ((mob->level > 20 && !is_trusted(ch, GOD))
			|| (mob->level > 10 && !is_trusted(ch, IMMORTAL))
			|| (mob->level > 5 && !is_trusted(ch, DEMI))
			|| (mob->level > 0 && !is_trusted(ch, ANGEL))
			|| !is_trusted(ch, AVATAR))
		{
			send_to_char("Your powers are not great enough for such a task.\n\r", ch);
			return;
		}

		clone = create_mobile(mob->pIndexData);
		clone_mobile(mob, clone);

		for (obj = mob->carrying; obj != nullptr; obj = obj->next_content)
		{
			if (obj_check(ch, obj))
			{
				new_obj = create_object(obj->pIndexData, 0);
				clone_object(obj, new_obj);
				recursive_clone(ch, obj, new_obj);
				obj_to_char(new_obj, clone);
				new_obj->wear_loc = obj->wear_loc;
			}
		}

		char_to_room(clone, ch->in_room);

		act("$n has created $N.", ch, nullptr, clone, TO_ROOM);
		act("You clone $N.", ch, nullptr, clone, TO_CHAR);

		sprintf(buf, "$N clones %s.", clone->short_descr);
		wiznet(buf, ch, nullptr, WIZ_LOAD, WIZ_SECURE, get_trust(ch));
	}
}